

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction_base.cpp
# Opt level: O0

TransactionStructApiBase * __thiscall
cfd::js::api::TransactionStructApiBase::ConvertLockingScriptTypeString_abi_cxx11_
          (TransactionStructApiBase *this,LockingScriptType script_type)

{
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  LockingScriptType local_14;
  TransactionStructApiBase *pTStack_10;
  LockingScriptType script_type_local;
  
  local_14 = script_type;
  pTStack_10 = this;
  switch(script_type) {
  case kNonStandard:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"nonstandard",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case kPayToPubkey:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"pubkey",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case kPayToPubkeyHash:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"pubkeyhash",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case kPayToScriptHash:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"scripthash",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case kMultisig:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"multisig",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case kNullData:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"nulldata",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case kWitnessV0ScriptHash:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"witness_v0_scripthash",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case kWitnessV0KeyHash:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"witness_v0_keyhash",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case kWitnessV1Taproot:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"witness_v1_taproot",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case kWitnessUnknown:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"witness_unknown",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case kTrue:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"true",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case kFee:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"fee",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
  }
  return this;
}

Assistant:

std::string TransactionStructApiBase::ConvertLockingScriptTypeString(
    LockingScriptType script_type) {
  switch (script_type) {
    case LockingScriptType::kNonStandard:
      return "nonstandard";
    case LockingScriptType::kPayToPubkey:
      return "pubkey";
    case LockingScriptType::kPayToPubkeyHash:
      return "pubkeyhash";
    case LockingScriptType::kPayToScriptHash:
      return "scripthash";
    case LockingScriptType::kMultisig:
      return "multisig";
    case LockingScriptType::kNullData:
      return "nulldata";
    case LockingScriptType::kWitnessV0ScriptHash:
      return "witness_v0_scripthash";
    case LockingScriptType::kWitnessV0KeyHash:
      return "witness_v0_keyhash";
    case LockingScriptType::kWitnessV1Taproot:
      return "witness_v1_taproot";
    case LockingScriptType::kWitnessUnknown:
      return "witness_unknown";
    case LockingScriptType::kTrue:
      return "true";
#ifndef CFD_DISABLE_ELEMENTS
    case LockingScriptType::kFee:
      return "fee";
#endif  // CFD_DISABLE_ELEMENTS
    default:
      break;
  }
  return "";
}